

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

void __thiscall Am_Text_Fragment::Add_Mark(Am_Text_Fragment *this,Am_Text_Mark *param_2)

{
  return;
}

Assistant:

void
Am_Text_Fragment::Add_Mark(Am_Text_Mark * /* inMarkToAdd */)
{
  return;

  /*
  Am_Text_Index searchIndex = inMarkToAdd->Get_Index();

  // check for legal range
  // if( searchIndex > mStrLen )
  //   error

  if( mFirstMark == (0L) )
  {
    // list empty; insert at beginning
    mFirstMark = inMarkToAdd;
    return;
  }

  if( mFirstMark->Get_Index() > searchIndex )
  {
    // insert at beginning of list
    inMarkToAdd->Set_Next( mFirstMark );
    mFirstMark = inMarkToAdd;
    return;
  }
*/

  // by now we are inserting after the first item
  // NDY: finish the insert
  //   Am_Rich_Text_Index* mark = mHead;
  //   while( mark != (0L) )
  //   {
  //     if( searchIndex > mark->Get_Index()
  //
  //   }
}